

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

Pos getSpawn(Generator *g)

{
  Pos PVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int tmp;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int x;
  uint uVar14;
  int grass;
  int local_4c7c;
  long local_4c78;
  ulong local_4c70;
  ulong local_4c68;
  ulong local_4c60;
  ulong local_4c58;
  ulong local_4c50;
  Generator *local_4c48;
  int local_4c3c;
  ulong local_4c38;
  ulong local_4c30;
  int id;
  float y;
  SurfaceNoise sn;
  
  PVar1 = estimateSpawn(g,&local_4c38);
  uVar4 = (ulong)PVar1 >> 0x20;
  if (1 < g->mc) {
    initSurfaceNoise(&sn,0,g->seed);
    local_4c48 = g;
    if (g->mc < 0x10) {
      iVar10 = 1000;
      do {
        grass = 0;
        uVar14 = PVar1.x;
        uVar12 = (uint)uVar4;
        mapApproxHeight(&y,&id,local_4c48,&sn,(int)uVar14 >> 2,(int)uVar12 >> 2,1,1);
        getBiomeDepthAndScale(id,(double *)0x0,(double *)0x0,&grass);
        if ((0 < grass) && ((float)grass <= y)) break;
        lVar2 = local_4c38 * 0x5deece66d + 0xb;
        lVar3 = lVar2 * 0x5deece66d + 0xb;
        uVar14 = (((uint)((ulong)lVar2 >> 0x2a) & 0x3f) + uVar14) -
                 ((uint)((ulong)lVar3 >> 0x2a) & 0x3f);
        lVar2 = lVar3 * 0x5deece66d + 0xb;
        uVar4 = lVar2 * 0x5deece66d + 0xb;
        local_4c38 = uVar4 & 0xffffffffffff;
        uVar12 = (((uint)((ulong)lVar2 >> 0x2a) & 0x3f) + uVar12) - ((uint)(uVar4 >> 0x2a) & 0x3f);
        uVar4 = (ulong)uVar12;
        PVar1.z = 0;
        PVar1.x = uVar14;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    else {
      if ((uint)g->mc < 0x16) {
        uVar14 = PVar1.x & 0xfffffff0;
        uVar12 = PVar1.z & 0xfffffff0;
        local_4c7c = -1;
        local_4c58 = 0;
        local_4c60 = 0;
        iVar10 = 0;
        local_4c68 = 0;
        do {
          if (((int)local_4c60 + 0xfU < 0x20) && ((int)local_4c68 + 0xfU < 0x20)) {
            local_4c70 = CONCAT44(local_4c70._4_4_,iVar10);
            uVar8 = (int)local_4c60 * 0x10 + uVar14;
            local_4c50 = (ulong)uVar8;
            iVar10 = (int)local_4c68 * 0x10 + uVar12;
            mapApproxHeight(&y,&id,g,&sn,(int)uVar8 >> 2,iVar10 >> 2,4,4);
            lVar3 = 0;
            lVar2 = 0;
            do {
              lVar5 = 0;
              lVar11 = lVar3;
              local_4c78 = lVar2;
              do {
                grass = 0;
                getBiomeDepthAndScale
                          (*(int *)((long)&id + lVar11),(double *)0x0,(double *)0x0,&grass);
                if ((0 < grass) &&
                   ((float)grass < *(float *)((long)&y + lVar11) ||
                    (float)grass == *(float *)((long)&y + lVar11))) {
                  uVar12 = iVar10 - (int)lVar5;
                  uVar14 = (int)local_4c50 + (int)local_4c78 * 4;
                  goto LAB_0010cbd5;
                }
                lVar5 = lVar5 + -4;
                lVar11 = lVar11 + 0x10;
              } while (lVar5 != -0x10);
              lVar2 = local_4c78 + 1;
              lVar3 = lVar3 + 4;
            } while (lVar2 != 4);
            g = local_4c48;
            iVar10 = (int)local_4c70;
          }
          iVar13 = (int)local_4c60;
          iVar7 = (int)local_4c68;
          if (((iVar13 == iVar7) || ((iVar13 < 0 && (iVar13 == -iVar7)))) ||
             ((0 < iVar13 && (iVar13 == 1 - iVar7)))) {
            iVar9 = -local_4c7c;
            local_4c7c = iVar10;
            iVar10 = iVar9;
          }
          local_4c60 = (ulong)(uint)(iVar13 + iVar10);
          local_4c68 = (ulong)(uint)(iVar7 + local_4c7c);
          uVar8 = (int)local_4c58 + 1;
          local_4c58 = (ulong)uVar8;
        } while (uVar8 != 0x400);
      }
      else {
        local_4c3c = -1;
        iVar10 = 0;
        local_4c68 = 0;
        local_4c7c = 0;
        local_4c70 = 0;
        do {
          if (((int)local_4c68 + 5U < 0xb) && ((int)local_4c70 + 5U < 0xb)) {
            local_4c30 = (ulong)((int)local_4c68 * 0x10 + (PVar1.x & 0xfffffff0U));
            iVar13 = (int)local_4c70 * 0x10 + ((uint)uVar4 & 0xfffffff0);
            uVar8 = 0;
            local_4c60 = CONCAT44(local_4c60._4_4_,iVar10);
            do {
              local_4c58 = (ulong)uVar8;
              uVar8 = (int)local_4c30 + uVar8 * 4;
              local_4c50 = CONCAT44(local_4c50._4_4_,(int)uVar8 >> 2);
              iVar10 = 0;
              PVar1 = (Pos)((ulong)PVar1 & 0xffffffff);
              uVar6 = uVar4;
              do {
                local_4c78 = CONCAT44(local_4c78._4_4_,PVar1.x);
                uVar12 = iVar13 + iVar10;
                mapApproxHeight(&y,&id,local_4c48,&sn,(int)local_4c50,(int)uVar12 >> 2,1,1);
                uVar14 = uVar8;
                if (63.0 < y) {
                  uVar12 = iVar13 + iVar10;
                  goto LAB_0010cbd5;
                }
                if ((0x32 < (uint)id) ||
                   (uVar4 = (ulong)uVar12, (0x4000000000c00U >> ((ulong)(uint)id & 0x3f) & 1) == 0))
                {
                  uVar4 = uVar6;
                  uVar14 = (uint)local_4c78;
                }
                PVar1.z = 0;
                PVar1.x = uVar14;
                uVar12 = (uint)uVar4;
                if (((uint)id < 0x33) && ((0x4000000000c00U >> ((ulong)(uint)id & 0x3f) & 1) != 0))
                goto LAB_0010cbd5;
                iVar10 = iVar10 + 4;
                uVar6 = uVar4;
              } while (iVar10 != 0x10);
              uVar8 = (int)local_4c58 + 1;
              iVar10 = (int)local_4c60;
            } while (uVar8 != 4);
          }
          iVar13 = (int)local_4c68;
          iVar7 = (int)local_4c70;
          if (((iVar13 == iVar7) || ((iVar13 < 0 && (iVar13 == -iVar7)))) ||
             ((0 < iVar13 && (iVar13 == 1 - iVar7)))) {
            iVar9 = -local_4c3c;
            local_4c3c = local_4c7c;
            local_4c7c = iVar9;
          }
          local_4c68 = (ulong)(uint)(iVar13 + local_4c7c);
          local_4c70 = (ulong)(uint)(iVar7 + local_4c3c);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0x79);
        uVar14 = PVar1.x & 0xfffffff0;
        uVar12 = (uint)uVar4 & 0xfffffff0;
      }
      uVar14 = uVar14 | 8;
      uVar12 = uVar12 | 8;
    }
LAB_0010cbd5:
    PVar1.z = 0;
    PVar1.x = uVar14;
    uVar4 = (ulong)uVar12;
  }
  return (Pos)((ulong)PVar1 & 0xffffffff | uVar4 << 0x20);
}

Assistant:

Pos getSpawn(const Generator *g)
{
    uint64_t rng;
    Pos spawn = estimateSpawn(g, &rng);
    int i, j, k, u, v, cx0, cz0;
    uint32_t ii, jj;

    if (g->mc <= MC_B1_7)
        return spawn;

    SurfaceNoise sn;
    initSurfaceNoise(&sn, DIM_OVERWORLD, g->seed);

    if (g->mc <= MC_1_12)
    {
        for (i = 0; i < 1000; i++)
        {
            float y;
            int id, grass = 0;
            mapApproxHeight(&y, &id, g, &sn, spawn.x >> 2, spawn.z >> 2, 1, 1);
            getBiomeDepthAndScale(id, 0, 0, &grass);
            if (grass > 0 && y >= grass)
                break;
            spawn.x += nextInt(&rng, 64) - nextInt(&rng, 64);
            spawn.z += nextInt(&rng, 64) - nextInt(&rng, 64);
        }
    }
    else if (g->mc <= MC_1_17)
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 1024; i++)
        {
            if (j > -16 && j <= 16 && k > -16 && k <= 16)
            {
                // find server spawn point in chunk
                float y[16];
                int ids[16];
                cx0 = (spawn.x & ~15) + j * 16; // start of chunk
                cz0 = (spawn.z & ~15) + k * 16;
                mapApproxHeight(y, ids, g, &sn, cx0 >> 2, cz0 >> 2, 4, 4);
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        int grass = 0;
                        getBiomeDepthAndScale(ids[jj*4+ii], 0, 0, &grass);
                        if (grass <= 0 || y[jj*4+ii] < grass)
                            continue;
                        spawn.x = cx0 + ii * 4;
                        spawn.z = cz0 + jj * 4;
                        return spawn;
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }
    else
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 121; i++)
        {
            if (j >= -5 && j <= 5 && k >= -5 && k <= 5)
            {
                // find server spawn point in chunk
                cx0 = (spawn.x & ~15) + j * 16;
                cz0 = (spawn.z & ~15) + k * 16;
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        float y;
                        int id;
                        int x = cx0 + ii * 4;
                        int z = cz0 + jj * 4;
                        mapApproxHeight(&y, &id, g, &sn, x >> 2, z >> 2, 1, 1);
                        if (y > 63 || id == frozen_ocean ||
                            id == deep_frozen_ocean || id == frozen_river)
                        {
                            spawn.x = x;
                            spawn.z = z;
                            return spawn;
                        }
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }

    return spawn;
}